

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O3

void __thiscall gutil::Properties::putValue<bool>(Properties *this,char *key,bool *value)

{
  ostringstream out;
  undefined1 *local_1b8;
  undefined1 local_1a8 [16];
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::ostream::_M_insert<bool>(SUB81(local_198,0));
  std::__cxx11::stringbuf::str();
  gutil::Properties::putString((char *)this,(string *)key);
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void putValue(const char *key, const T &value)
    {
      std::ostringstream out;
      out << value;
      putString(key, out.str());
    }